

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSOSerializer.cpp
# Opt level: O0

bool Diligent::ShaderSerializer<(Diligent::SerializerMode)2>::SerializeBytecodeOrSource
               (Serializer<(Diligent::SerializerMode)2> *Ser,ConstQual<ShaderCreateInfo> *CI)

{
  bool bVar1;
  Char *Message;
  uchar local_4d [8];
  Uint8 UseBytecode;
  undefined1 local_40 [8];
  string msg;
  ConstQual<ShaderCreateInfo> *CI_local;
  Serializer<(Diligent::SerializerMode)2> *Ser_local;
  
  msg.field_2._8_8_ = CI;
  if ((CI->Source != (Char *)0x0) && (CI->ByteCode != (void *)0x0)) {
    FormatString<char[47]>
              ((string *)local_40,(char (*) [47])"Only one of Source or Bytecode can be non-null");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"SerializeBytecodeOrSource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PSOSerializer.cpp"
               ,0x1ca);
    std::__cxx11::string::~string((string *)local_40);
  }
  local_4d[0] = *(long *)(msg.field_2._8_8_ + 0x18) != 0;
  bVar1 = Serializer<(Diligent::SerializerMode)2>::operator()(Ser,local_4d);
  if (bVar1) {
    if (local_4d[0] == '\0') {
      Ser_local._7_1_ =
           Serializer<(Diligent::SerializerMode)2>::SerializeBytes
                     (Ser,*(VoidPtr *)(msg.field_2._8_8_ + 0x10),
                      (ConstQual<size_t> *)(msg.field_2._8_8_ + 0x20),8);
    }
    else {
      Ser_local._7_1_ =
           Serializer<(Diligent::SerializerMode)2>::SerializeBytes
                     (Ser,*(VoidPtr *)(msg.field_2._8_8_ + 0x18),
                      (ConstQual<size_t> *)(msg.field_2._8_8_ + 0x20),8);
    }
  }
  else {
    Ser_local._7_1_ = false;
  }
  return Ser_local._7_1_;
}

Assistant:

bool ShaderSerializer<Mode>::SerializeBytecodeOrSource(Serializer<Mode>&            Ser,
                                                       ConstQual<ShaderCreateInfo>& CI)
{
    VERIFY(CI.Source == nullptr || CI.ByteCode == nullptr, "Only one of Source or Bytecode can be non-null");
    const Uint8 UseBytecode = CI.ByteCode != nullptr ? 1 : 0;

    if (!Ser(UseBytecode))
        return false;

    if (UseBytecode)
        return Ser.SerializeBytes(CI.ByteCode, CI.ByteCodeSize);
    else
        return Ser.SerializeBytes(CI.Source, CI.SourceLength);
}